

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDG2Dot.h
# Opt level: O3

void __thiscall
dg::debug::LLVMDGDumpBlocks::dumpSubgraph
          (LLVMDGDumpBlocks *this,LLVMDependenceGraph *graph,char *name)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_node_base *p_Var2;
  
  DG2Dot<dg::LLVMNode>::dumpSubgraphStart
            (&this->super_DG2Dot<dg::LLVMNode>,(DependenceGraph<dg::LLVMNode> *)graph,name);
  p_Var2 = *(_Rb_tree_node_base **)(graph + 0x78);
  p_Var1 = (_Rb_tree_node_base *)(graph + 0x68);
  if (p_Var2 != p_Var1) {
    do {
      dumpBlock(this,(LLVMBBlock *)p_Var2[1]._M_parent);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != p_Var1);
    p_Var2 = *(_Rb_tree_node_base **)(graph + 0x78);
  }
  for (; p_Var2 != p_Var1; p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    dumpBlockEdges(this,(LLVMBBlock *)p_Var2[1]._M_parent);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&(this->super_DG2Dot<dg::LLVMNode>).out,"\t}\n",3);
  return;
}

Assistant:

void dumpSubgraph(LLVMDependenceGraph *graph, const char *name) {
        dumpSubgraphStart(graph, name);

        for (auto &B : graph->getBlocks()) {
            dumpBlock(B.second);
        }

        for (auto &B : graph->getBlocks()) {
            dumpBlockEdges(B.second);
        }

        dumpSubgraphEnd(graph, false);
    }